

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyHashRelease(SyHash *pHash)

{
  SyHashEntry_Pr *pSVar1;
  sxu32 sVar2;
  sxi32 sVar3;
  SyHashEntry_Pr *pChunk;
  
  sVar2 = pHash->nEntry;
  pChunk = pHash->pList;
  while (sVar2 != 0) {
    pSVar1 = pChunk->pNext;
    SyMemBackendPoolFree(pHash->pAllocator,pChunk);
    sVar2 = pHash->nEntry - 1;
    pHash->nEntry = sVar2;
    pChunk = pSVar1;
  }
  sVar3 = 0;
  if (pHash->apBucket != (SyHashEntry_Pr **)0x0) {
    sVar3 = SyMemBackendFree(pHash->pAllocator,pHash->apBucket);
  }
  pHash->apBucket = (SyHashEntry_Pr **)0x0;
  pHash->nBucketSize = 0;
  pHash->pAllocator = (SyMemBackend *)0x0;
  return sVar3;
}

Assistant:

JX9_PRIVATE sxi32 SyHashRelease(SyHash *pHash)
{
	SyHashEntry_Pr *pEntry, *pNext;
#if defined(UNTRUST)
	if( INVALID_HASH(pHash)  ){
		return SXERR_EMPTY;
	}
#endif
	pEntry = pHash->pList;
	for(;;){
		if( pHash->nEntry == 0 ){
			break;
		}
		pNext = pEntry->pNext;
		SyMemBackendPoolFree(pHash->pAllocator, pEntry);
		pEntry = pNext;
		pHash->nEntry--;
	}
	if( pHash->apBucket ){
		SyMemBackendFree(pHash->pAllocator, (void *)pHash->apBucket);
	}
	pHash->apBucket = 0;
	pHash->nBucketSize = 0;
	pHash->pAllocator = 0;
	return SXRET_OK;
}